

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XSValueTest.cpp
# Opt level: O0

void test_dt_positiveInteger(void)

{
  XSValue_Data actValue;
  XSValue_Data actValue_00;
  XSValue_Data expValue;
  XSValue_Data expValue_00;
  byte bVar1;
  bool bVar2;
  XMLCh *pXVar3;
  char *pcVar4;
  XSValue *pXVar5;
  char *pcVar6;
  char *pcVar7;
  wchar16 *pwVar8;
  long lVar9;
  void *pvVar10;
  bool bVar11;
  StrX local_5d0;
  StrX local_5c0;
  StrX local_5b0;
  long local_5a0;
  XMLCh *actRetCanRep_5;
  undefined1 local_590 [4];
  Status myStatus_16;
  StrX local_580;
  StrX local_570;
  long local_560;
  XMLCh *actRetCanRep_4;
  undefined1 local_550 [4];
  Status myStatus_15;
  StrX local_540;
  char *local_530;
  char *actRetCanRep_inchar_3;
  wchar16 *local_518;
  XMLCh *actRetCanRep_3;
  undefined1 local_508 [4];
  Status myStatus_14;
  StrX local_4f8;
  char *local_4e8;
  char *actRetCanRep_inchar_2;
  wchar16 *local_4d0;
  XMLCh *actRetCanRep_2;
  undefined1 local_4c0 [4];
  Status myStatus_13;
  StrX local_4b0;
  char *local_4a0;
  char *actRetCanRep_inchar_1;
  wchar16 *local_488;
  XMLCh *actRetCanRep_1;
  undefined1 local_478 [4];
  Status myStatus_12;
  StrX local_468;
  char *local_458;
  char *actRetCanRep_inchar;
  wchar16 *local_440;
  XMLCh *actRetCanRep;
  Status myStatus_11;
  int j;
  StrX local_420;
  StrX local_410;
  XSValue *local_400;
  XSValue *actRetValue_4;
  undefined1 local_3f0 [4];
  Status myStatus_10;
  StrX local_3e0;
  StrX local_3d0;
  XSValue *local_3c0;
  XSValue *actRetValue_3;
  undefined1 local_3b0 [4];
  Status myStatus_9;
  StrX local_3a0;
  StrX local_390;
  XSValue *local_380;
  XSValue *actRetValue_2;
  undefined1 local_370 [4];
  Status myStatus_8;
  undefined8 local_360;
  undefined8 uStack_358;
  undefined8 local_350;
  undefined8 uStack_348;
  undefined8 local_340;
  undefined8 local_338;
  undefined8 uStack_330;
  undefined8 local_328;
  undefined8 uStack_320;
  undefined8 local_318;
  StrX local_310;
  XSValue *local_300;
  XSValue *actRetValue_1;
  undefined1 local_2f0 [4];
  Status myStatus_7;
  undefined8 local_2e0;
  undefined8 uStack_2d8;
  undefined8 local_2d0;
  undefined8 uStack_2c8;
  undefined8 local_2c0;
  undefined8 local_2b8;
  undefined8 uStack_2b0;
  undefined8 local_2a8;
  undefined8 uStack_2a0;
  undefined8 local_298;
  StrX local_290;
  XSValue *local_280;
  XSValue *actRetValue;
  Status myStatus_6;
  int i;
  StrX local_260;
  StrX local_250;
  byte local_23d;
  Status local_23c;
  undefined1 local_238 [3];
  bool actRetValid_5;
  Status myStatus_5;
  StrX local_228;
  StrX local_218;
  byte local_205;
  Status local_204;
  undefined1 local_200 [3];
  bool actRetValid_4;
  Status myStatus_4;
  StrX local_1f0;
  byte local_1dd;
  Status local_1dc;
  undefined1 local_1d8 [3];
  bool actRetValid_3;
  Status myStatus_3;
  StrX local_1c8;
  byte local_1b5;
  Status local_1b4;
  undefined1 local_1b0 [3];
  bool actRetValid_2;
  Status myStatus_2;
  StrX local_1a0;
  StrX local_190;
  byte local_17d;
  Status local_17c;
  undefined1 local_178 [3];
  bool actRetValid_1;
  Status myStatus_1;
  StrX local_158;
  byte local_145;
  Status local_144;
  char acStack_140 [3];
  bool actRetValid;
  Status myStatus;
  char data_canrep_2 [6];
  char data_rawstr_2 [10];
  char data_canrep_1 [2];
  char data_rawstr_1 [8];
  char lex_iv_2 [8];
  char lex_iv_1 [10];
  char cStack_106;
  char cStack_105;
  char cStack_104;
  char cStack_103;
  char cStack_102;
  char cStack_101;
  char lex_v_ran64_iv_2_canrep [21];
  char acStack_e8 [8];
  char lex_v_ran64_v_2_canrep [21];
  XSValue_Data act_v_ran32_v_2;
  XSValue_Data act_v_ran64_v_2;
  XSValue_Data act_v_ran_v_1;
  char lex_v_ran64_iv_2 [22];
  char acStack_38 [8];
  char lex_v_ran64_v_2 [22];
  char lex_v_ran_iv_1 [2];
  char lex_v_ran_v_1 [12];
  bool toValidate;
  DataType dt;
  
  stack0xffffffffffffffe0 = 0x2034333231202020;
  lex_v_ran64_v_2[0xe] = '0';
  lex_v_ran64_v_2[0xf] = '\0';
  lex_v_ran64_v_2[8] = '5';
  lex_v_ran64_v_2[9] = '1';
  lex_v_ran64_v_2[10] = '6';
  lex_v_ran64_v_2[0xb] = '1';
  lex_v_ran64_v_2[0xc] = '5';
  lex_v_ran64_v_2[0xd] = '\0';
  builtin_strncpy(acStack_38,"+1844674",8);
  lex_v_ran64_v_2[0] = '4';
  lex_v_ran64_v_2[1] = '0';
  lex_v_ran64_v_2[2] = '7';
  lex_v_ran64_v_2[3] = '3';
  lex_v_ran64_v_2[4] = '7';
  lex_v_ran64_v_2[5] = '0';
  lex_v_ran64_v_2[6] = '9';
  lex_v_ran64_v_2[7] = '5';
  act_v_ran_v_1.fValue.f_datetime.f_milisec = 3.697842578956724e-57;
  act_v_ran_v_1.f_datatype = 0x4d2;
  act_v_ran_v_1._4_4_ = 0;
  act_v_ran64_v_2.f_datatype = ~dt_string;
  act_v_ran64_v_2._4_4_ = 0xffffffff;
  act_v_ran32_v_2.f_datatype = ~dt_string;
  act_v_ran32_v_2._4_4_ = 0;
  builtin_strncpy(lex_v_ran64_v_2_canrep + 8,"1615",5);
  builtin_strncpy(acStack_e8,"18446744",8);
  builtin_strncpy(lex_v_ran64_v_2_canrep,"07370955",8);
  lex_iv_1[8] = '1';
  lex_iv_1[9] = '8';
  cStack_106 = '4';
  cStack_105 = '4';
  cStack_104 = '6';
  cStack_103 = '7';
  cStack_102 = '4';
  cStack_101 = '4';
  builtin_strncpy(lex_iv_2,"12b34.45",8);
  lex_iv_1[0] = '6';
  lex_iv_1[1] = '\0';
  builtin_strncpy(data_rawstr_1,"1234b56",8);
  stack0xfffffffffffffed8 = 0xa2020312b2020;
  data_rawstr_2[6] = '1';
  data_rawstr_2[7] = '\0';
  _data_canrep_2 = 0x343332313030302b;
  data_rawstr_2[0] = '5';
  data_rawstr_2[1] = '\0';
  myStatus._0_2_ = 0x35;
  _acStack_140 = 0x34333231;
  local_144 = st_Init;
  StrX::StrX(&local_158,lex_v_ran64_v_2 + 0x10);
  pXVar3 = StrX::unicodeForm(&local_158);
  bVar1 = xercesc_4_0::XSValue::validate
                    (pXVar3,dt_positiveInteger,&local_144,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_158);
  local_145 = bVar1 & 1;
  if (local_145 != 1) {
    pXVar3 = getDataTypeString(dt_positiveInteger);
    StrX::StrX((StrX *)local_178,pXVar3);
    pcVar4 = StrX::localForm((StrX *)local_178);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0xc32,lex_v_ran64_v_2 + 0x10,pcVar4,1);
    StrX::~StrX((StrX *)local_178);
    errSeen = true;
  }
  local_17c = st_Init;
  StrX::StrX(&local_190,lex_v_ran64_v_2 + 0xe);
  pXVar3 = StrX::unicodeForm(&local_190);
  bVar1 = xercesc_4_0::XSValue::validate
                    (pXVar3,dt_positiveInteger,&local_17c,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_190);
  local_17d = bVar1 & 1;
  if (local_17d == 0) {
    if (local_17c != st_FOCA0002) {
      pXVar3 = getDataTypeString(dt_positiveInteger);
      StrX::StrX((StrX *)local_1b0,pXVar3);
      pcVar4 = StrX::localForm((StrX *)local_1b0);
      pcVar6 = getStatusString(st_FOCA0002);
      pcVar7 = getStatusString(local_17c);
      printf("VALIDATE_TEST Context Diff,                                                        at line <%d>, data=<%s> datatype=<%s>,                                               expStatus=<%s>, actStatus=<%s>\n"
             ,0xc33,lex_v_ran64_v_2 + 0xe,pcVar4,pcVar6,pcVar7);
      StrX::~StrX((StrX *)local_1b0);
      errSeen = true;
    }
  }
  else {
    pXVar3 = getDataTypeString(dt_positiveInteger);
    StrX::StrX(&local_1a0,pXVar3);
    pcVar4 = StrX::localForm(&local_1a0);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0xc33,lex_v_ran64_v_2 + 0xe,pcVar4,0);
    StrX::~StrX(&local_1a0);
    errSeen = true;
  }
  local_1b4 = st_Init;
  StrX::StrX(&local_1c8,acStack_38);
  pXVar3 = StrX::unicodeForm(&local_1c8);
  bVar1 = xercesc_4_0::XSValue::validate
                    (pXVar3,dt_positiveInteger,&local_1b4,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_1c8);
  local_1b5 = bVar1 & 1;
  if (local_1b5 != 1) {
    pXVar3 = getDataTypeString(dt_positiveInteger);
    StrX::StrX((StrX *)local_1d8,pXVar3);
    pcVar4 = StrX::localForm((StrX *)local_1d8);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0xc35,acStack_38,pcVar4,1);
    StrX::~StrX((StrX *)local_1d8);
    errSeen = true;
  }
  local_1dc = st_Init;
  StrX::StrX(&local_1f0,(char *)((long)&act_v_ran_v_1.fValue + 0x18));
  pXVar3 = StrX::unicodeForm(&local_1f0);
  bVar1 = xercesc_4_0::XSValue::validate
                    (pXVar3,dt_positiveInteger,&local_1dc,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_1f0);
  local_1dd = bVar1 & 1;
  if (local_1dd != 1) {
    pXVar3 = getDataTypeString(dt_positiveInteger);
    StrX::StrX((StrX *)local_200,pXVar3);
    pcVar4 = StrX::localForm((StrX *)local_200);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0xc36,(undefined1 *)((long)&act_v_ran_v_1.fValue + 0x18),pcVar4,1);
    StrX::~StrX((StrX *)local_200);
    errSeen = true;
  }
  local_204 = st_Init;
  StrX::StrX(&local_218,lex_iv_2);
  pXVar3 = StrX::unicodeForm(&local_218);
  bVar1 = xercesc_4_0::XSValue::validate
                    (pXVar3,dt_positiveInteger,&local_204,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_218);
  local_205 = bVar1 & 1;
  if (local_205 == 0) {
    if (local_204 != st_FOCA0002) {
      pXVar3 = getDataTypeString(dt_positiveInteger);
      StrX::StrX((StrX *)local_238,pXVar3);
      pcVar4 = StrX::localForm((StrX *)local_238);
      pcVar6 = getStatusString(st_FOCA0002);
      pcVar7 = getStatusString(local_204);
      printf("VALIDATE_TEST Context Diff,                                                        at line <%d>, data=<%s> datatype=<%s>,                                               expStatus=<%s>, actStatus=<%s>\n"
             ,0xc39,lex_iv_2,pcVar4,pcVar6,pcVar7);
      StrX::~StrX((StrX *)local_238);
      errSeen = true;
    }
  }
  else {
    pXVar3 = getDataTypeString(dt_positiveInteger);
    StrX::StrX(&local_228,pXVar3);
    pcVar4 = StrX::localForm(&local_228);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0xc39,lex_iv_2,pcVar4,0);
    StrX::~StrX(&local_228);
    errSeen = true;
  }
  local_23c = st_Init;
  StrX::StrX(&local_250,data_rawstr_1);
  pXVar3 = StrX::unicodeForm(&local_250);
  bVar1 = xercesc_4_0::XSValue::validate
                    (pXVar3,dt_positiveInteger,&local_23c,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_250);
  local_23d = bVar1 & 1;
  if (local_23d == 0) {
    if (local_23c != st_FOCA0002) {
      pXVar3 = getDataTypeString(dt_positiveInteger);
      StrX::StrX((StrX *)&myStatus_6,pXVar3);
      pcVar4 = StrX::localForm((StrX *)&myStatus_6);
      pcVar6 = getStatusString(st_FOCA0002);
      pcVar7 = getStatusString(local_23c);
      printf("VALIDATE_TEST Context Diff,                                                        at line <%d>, data=<%s> datatype=<%s>,                                               expStatus=<%s>, actStatus=<%s>\n"
             ,0xc3a,data_rawstr_1,pcVar4,pcVar6,pcVar7);
      StrX::~StrX((StrX *)&myStatus_6);
      errSeen = true;
    }
  }
  else {
    pXVar3 = getDataTypeString(dt_positiveInteger);
    StrX::StrX(&local_260,pXVar3);
    pcVar4 = StrX::localForm(&local_260);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0xc3a,data_rawstr_1,pcVar4,0);
    StrX::~StrX(&local_260);
    errSeen = true;
  }
  for (actRetValue._4_4_ = 0; actRetValue._4_4_ < 2; actRetValue._4_4_ = actRetValue._4_4_ + 1) {
    bVar11 = actRetValue._4_4_ == 0;
    actRetValue._0_4_ = 0;
    StrX::StrX(&local_290,lex_v_ran64_v_2 + 0x10);
    pXVar3 = StrX::unicodeForm(&local_290);
    pXVar5 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (pXVar3,dt_positiveInteger,(Status *)&actRetValue,ver_10,bVar11,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_290);
    local_280 = pXVar5;
    if (pXVar5 == (XSValue *)0x0) {
      pXVar3 = getDataTypeString(dt_positiveInteger);
      StrX::StrX((StrX *)local_2f0,pXVar3);
      StrX::localForm((StrX *)local_2f0);
      printf("ACTVALUE_TEST No XSValue returned,                                                     at line <%d> data=<%s>, datatype=<%s>\n"
             ,0xc57,lex_v_ran64_v_2 + 0x10);
      StrX::~StrX((StrX *)local_2f0);
      errSeen = true;
    }
    else {
      memcpy(&local_2b8,pXVar5,0x28);
      pvVar10 = (void *)((long)&act_v_ran64_v_2.fValue + 0x18);
      memcpy(&local_2e0,pvVar10,0x28);
      actValue.fValue.f_long = uStack_2b0;
      actValue._0_8_ = local_2b8;
      actValue.fValue._8_8_ = local_2a8;
      actValue.fValue._16_8_ = uStack_2a0;
      actValue.fValue.f_datetime.f_milisec = (double)local_298;
      expValue.fValue.f_long = uStack_2d8;
      expValue._0_8_ = local_2e0;
      expValue.fValue._8_8_ = local_2d0;
      expValue.fValue._16_8_ = uStack_2c8;
      expValue.fValue.f_datetime.f_milisec = (double)local_2c0;
      bVar2 = compareActualValue(dt_positiveInteger,actValue,expValue);
      pXVar5 = local_280;
      if (!bVar2) {
        errSeen = true;
      }
      if (local_280 != (XSValue *)0x0) {
        xercesc_4_0::XSValue::~XSValue(local_280);
        xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar5,pvVar10);
      }
    }
    actRetValue_1._4_4_ = 0;
    StrX::StrX(&local_310,acStack_38);
    pXVar3 = StrX::unicodeForm(&local_310);
    pXVar5 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (pXVar3,dt_positiveInteger,(Status *)((long)&actRetValue_1 + 4),ver_10,bVar11
                        ,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_310);
    local_300 = pXVar5;
    if (pXVar5 == (XSValue *)0x0) {
      pXVar3 = getDataTypeString(dt_positiveInteger);
      StrX::StrX((StrX *)local_370,pXVar3);
      StrX::localForm((StrX *)local_370);
      printf("ACTVALUE_TEST No XSValue returned,                                                     at line <%d> data=<%s>, datatype=<%s>\n"
             ,0xc59,acStack_38);
      StrX::~StrX((StrX *)local_370);
      errSeen = true;
    }
    else {
      memcpy(&local_338,pXVar5,0x28);
      pvVar10 = (void *)((long)&act_v_ran32_v_2.fValue + 0x18);
      memcpy(&local_360,pvVar10,0x28);
      actValue_00.fValue.f_long = uStack_330;
      actValue_00._0_8_ = local_338;
      actValue_00.fValue._8_8_ = local_328;
      actValue_00.fValue._16_8_ = uStack_320;
      actValue_00.fValue.f_datetime.f_milisec = (double)local_318;
      expValue_00.fValue.f_long = uStack_358;
      expValue_00._0_8_ = local_360;
      expValue_00.fValue._8_8_ = local_350;
      expValue_00.fValue._16_8_ = uStack_348;
      expValue_00.fValue.f_datetime.f_milisec = (double)local_340;
      bVar2 = compareActualValue(dt_positiveInteger,actValue_00,expValue_00);
      pXVar5 = local_300;
      if (!bVar2) {
        errSeen = true;
      }
      if (local_300 != (XSValue *)0x0) {
        xercesc_4_0::XSValue::~XSValue(local_300);
        xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar5,pvVar10);
      }
    }
    actRetValue_2._4_4_ = st_Init;
    StrX::StrX(&local_390,(char *)((long)&act_v_ran_v_1.fValue + 0x18));
    pXVar3 = StrX::unicodeForm(&local_390);
    pXVar5 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (pXVar3,dt_positiveInteger,(Status *)((long)&actRetValue_2 + 4),ver_10,bVar11
                        ,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_390);
    local_380 = pXVar5;
    if (pXVar5 == (XSValue *)0x0) {
      if (actRetValue_2._4_4_ != st_FOCA0003) {
        pXVar3 = getDataTypeString(dt_positiveInteger);
        StrX::StrX((StrX *)local_3b0,pXVar3);
        pcVar4 = StrX::localForm((StrX *)local_3b0);
        pcVar6 = getStatusString(st_FOCA0003);
        pcVar7 = getStatusString(actRetValue_2._4_4_);
        printf("ACTVALUE_TEST Context Diff,                                                            at line <%d> data=<%s>, datatype=<%s>,                                                 expStatus=<%s>, actStatus=<%s>\n"
               ,0xc5a,(undefined1 *)((long)&act_v_ran_v_1.fValue + 0x18),pcVar4,pcVar6,pcVar7);
        StrX::~StrX((StrX *)local_3b0);
        errSeen = true;
      }
    }
    else {
      pXVar3 = getDataTypeString(dt_positiveInteger);
      StrX::StrX(&local_3a0,pXVar3);
      StrX::localForm(&local_3a0);
      pvVar10 = (void *)0xc5a;
      printf("ACTVALUE_TEST XSValue returned,                                                        at line <%d> data=<%s>, datatype=<%s>\n"
             ,0xc5a,(undefined1 *)((long)&act_v_ran_v_1.fValue + 0x18));
      StrX::~StrX(&local_3a0);
      pXVar5 = local_380;
      errSeen = true;
      if (local_380 != (XSValue *)0x0) {
        xercesc_4_0::XSValue::~XSValue(local_380);
        xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar5,pvVar10);
      }
    }
    actRetValue_3._4_4_ = st_Init;
    StrX::StrX(&local_3d0,lex_iv_2);
    pXVar3 = StrX::unicodeForm(&local_3d0);
    pXVar5 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (pXVar3,dt_positiveInteger,(Status *)((long)&actRetValue_3 + 4),ver_10,bVar11
                        ,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_3d0);
    local_3c0 = pXVar5;
    if (pXVar5 == (XSValue *)0x0) {
      if (actRetValue_3._4_4_ != st_FOCA0002) {
        pXVar3 = getDataTypeString(dt_positiveInteger);
        StrX::StrX((StrX *)local_3f0,pXVar3);
        pcVar4 = StrX::localForm((StrX *)local_3f0);
        pcVar6 = getStatusString(st_FOCA0002);
        pcVar7 = getStatusString(actRetValue_3._4_4_);
        printf("ACTVALUE_TEST Context Diff,                                                            at line <%d> data=<%s>, datatype=<%s>,                                                 expStatus=<%s>, actStatus=<%s>\n"
               ,0xc5c,lex_iv_2,pcVar4,pcVar6,pcVar7);
        StrX::~StrX((StrX *)local_3f0);
        errSeen = true;
      }
    }
    else {
      pXVar3 = getDataTypeString(dt_positiveInteger);
      StrX::StrX(&local_3e0,pXVar3);
      StrX::localForm(&local_3e0);
      pvVar10 = (void *)0xc5c;
      printf("ACTVALUE_TEST XSValue returned,                                                        at line <%d> data=<%s>, datatype=<%s>\n"
             ,0xc5c,lex_iv_2);
      StrX::~StrX(&local_3e0);
      pXVar5 = local_3c0;
      errSeen = true;
      if (local_3c0 != (XSValue *)0x0) {
        xercesc_4_0::XSValue::~XSValue(local_3c0);
        xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar5,pvVar10);
      }
    }
    actRetValue_4._4_4_ = st_Init;
    StrX::StrX(&local_410,data_rawstr_1);
    pXVar3 = StrX::unicodeForm(&local_410);
    pXVar5 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (pXVar3,dt_positiveInteger,(Status *)((long)&actRetValue_4 + 4),ver_10,bVar11
                        ,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_410);
    local_400 = pXVar5;
    if (pXVar5 == (XSValue *)0x0) {
      if (actRetValue_4._4_4_ != st_FOCA0002) {
        pXVar3 = getDataTypeString(dt_positiveInteger);
        StrX::StrX((StrX *)&myStatus_11,pXVar3);
        pcVar4 = StrX::localForm((StrX *)&myStatus_11);
        pcVar6 = getStatusString(st_FOCA0002);
        pcVar7 = getStatusString(actRetValue_4._4_4_);
        printf("ACTVALUE_TEST Context Diff,                                                            at line <%d> data=<%s>, datatype=<%s>,                                                 expStatus=<%s>, actStatus=<%s>\n"
               ,0xc5d,data_rawstr_1,pcVar4,pcVar6,pcVar7);
        StrX::~StrX((StrX *)&myStatus_11);
        errSeen = true;
      }
    }
    else {
      pXVar3 = getDataTypeString(dt_positiveInteger);
      StrX::StrX(&local_420,pXVar3);
      StrX::localForm(&local_420);
      pvVar10 = (void *)0xc5d;
      printf("ACTVALUE_TEST XSValue returned,                                                        at line <%d> data=<%s>, datatype=<%s>\n"
             ,0xc5d,data_rawstr_1);
      StrX::~StrX(&local_420);
      pXVar5 = local_400;
      errSeen = true;
      if (local_400 != (XSValue *)0x0) {
        xercesc_4_0::XSValue::~XSValue(local_400);
        xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar5,pvVar10);
      }
    }
  }
  for (actRetCanRep._4_4_ = 0; actRetCanRep._4_4_ < 2; actRetCanRep._4_4_ = actRetCanRep._4_4_ + 1)
  {
    bVar11 = actRetCanRep._4_4_ == 0;
    actRetCanRep._0_4_ = 0;
    StrX::StrX((StrX *)&actRetCanRep_inchar,data_rawstr_2 + 8);
    pXVar3 = StrX::unicodeForm((StrX *)&actRetCanRep_inchar);
    pwVar8 = (wchar16 *)
             xercesc_4_0::XSValue::getCanonicalRepresentation
                       (pXVar3,dt_positiveInteger,(Status *)&actRetCanRep,ver_10,bVar11,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX((StrX *)&actRetCanRep_inchar);
    local_440 = pwVar8;
    if (pwVar8 == (wchar16 *)0x0) {
      pXVar3 = getDataTypeString(dt_positiveInteger);
      StrX::StrX((StrX *)local_478,pXVar3);
      StrX::localForm((StrX *)local_478);
      printf("CANREP_TEST No CanRep returned,                                                       at line <%d> data=<%s>, datatype=<%s>\n"
             ,0xc7b,data_rawstr_2 + 8);
      StrX::~StrX((StrX *)local_478);
      errSeen = true;
    }
    else {
      local_458 = (char *)xercesc_4_0::XMLString::transcode
                                    (pwVar8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      bVar2 = xercesc_4_0::XMLString::equals(local_458,data_rawstr_2 + 6);
      if (!bVar2) {
        pXVar3 = getDataTypeString(dt_positiveInteger);
        StrX::StrX(&local_468,pXVar3);
        pcVar4 = StrX::localForm(&local_468);
        printf("CANREP_TEST CanRep Diff                                                         , at line <%d> data=<%s>, datatype=<%s>,                                                actCanRep=<%s>, toCompare=<%s>\n"
               ,0xc7b,data_rawstr_2 + 8,pcVar4,local_458,data_rawstr_2 + 6);
        StrX::~StrX(&local_468);
        errSeen = true;
      }
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,local_440);
      xercesc_4_0::XMLString::release(&local_458,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    actRetCanRep_1._4_4_ = 0;
    StrX::StrX((StrX *)&actRetCanRep_inchar_1,data_canrep_2);
    pXVar3 = StrX::unicodeForm((StrX *)&actRetCanRep_inchar_1);
    pwVar8 = (wchar16 *)
             xercesc_4_0::XSValue::getCanonicalRepresentation
                       (pXVar3,dt_positiveInteger,(Status *)((long)&actRetCanRep_1 + 4),ver_10,
                        bVar11,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX((StrX *)&actRetCanRep_inchar_1);
    local_488 = pwVar8;
    if (pwVar8 == (wchar16 *)0x0) {
      pXVar3 = getDataTypeString(dt_positiveInteger);
      StrX::StrX((StrX *)local_4c0,pXVar3);
      StrX::localForm((StrX *)local_4c0);
      printf("CANREP_TEST No CanRep returned,                                                       at line <%d> data=<%s>, datatype=<%s>\n"
             ,0xc7c,data_canrep_2);
      StrX::~StrX((StrX *)local_4c0);
      errSeen = true;
    }
    else {
      local_4a0 = (char *)xercesc_4_0::XMLString::transcode
                                    (pwVar8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      bVar2 = xercesc_4_0::XMLString::equals(local_4a0,acStack_140);
      if (!bVar2) {
        pXVar3 = getDataTypeString(dt_positiveInteger);
        StrX::StrX(&local_4b0,pXVar3);
        pcVar4 = StrX::localForm(&local_4b0);
        printf("CANREP_TEST CanRep Diff                                                         , at line <%d> data=<%s>, datatype=<%s>,                                                actCanRep=<%s>, toCompare=<%s>\n"
               ,0xc7c,data_canrep_2,pcVar4,local_4a0,acStack_140);
        StrX::~StrX(&local_4b0);
        errSeen = true;
      }
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,local_488);
      xercesc_4_0::XMLString::release(&local_4a0,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    actRetCanRep_2._4_4_ = 0;
    StrX::StrX((StrX *)&actRetCanRep_inchar_2,acStack_38);
    pXVar3 = StrX::unicodeForm((StrX *)&actRetCanRep_inchar_2);
    pwVar8 = (wchar16 *)
             xercesc_4_0::XSValue::getCanonicalRepresentation
                       (pXVar3,dt_positiveInteger,(Status *)((long)&actRetCanRep_2 + 4),ver_10,
                        bVar11,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX((StrX *)&actRetCanRep_inchar_2);
    local_4d0 = pwVar8;
    if (pwVar8 == (wchar16 *)0x0) {
      pXVar3 = getDataTypeString(dt_positiveInteger);
      StrX::StrX((StrX *)local_508,pXVar3);
      StrX::localForm((StrX *)local_508);
      printf("CANREP_TEST No CanRep returned,                                                       at line <%d> data=<%s>, datatype=<%s>\n"
             ,0xc7e,acStack_38);
      StrX::~StrX((StrX *)local_508);
      errSeen = true;
    }
    else {
      local_4e8 = (char *)xercesc_4_0::XMLString::transcode
                                    (pwVar8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      bVar2 = xercesc_4_0::XMLString::equals(local_4e8,acStack_e8);
      if (!bVar2) {
        pXVar3 = getDataTypeString(dt_positiveInteger);
        StrX::StrX(&local_4f8,pXVar3);
        pcVar4 = StrX::localForm(&local_4f8);
        printf("CANREP_TEST CanRep Diff                                                         , at line <%d> data=<%s>, datatype=<%s>,                                                actCanRep=<%s>, toCompare=<%s>\n"
               ,0xc7e,acStack_38,pcVar4,local_4e8,acStack_e8);
        StrX::~StrX(&local_4f8);
        errSeen = true;
      }
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,local_4d0);
      xercesc_4_0::XMLString::release(&local_4e8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    actRetCanRep_3._4_4_ = 0;
    StrX::StrX((StrX *)&actRetCanRep_inchar_3,(char *)((long)&act_v_ran_v_1.fValue + 0x18));
    pXVar3 = StrX::unicodeForm((StrX *)&actRetCanRep_inchar_3);
    pwVar8 = (wchar16 *)
             xercesc_4_0::XSValue::getCanonicalRepresentation
                       (pXVar3,dt_positiveInteger,(Status *)((long)&actRetCanRep_3 + 4),ver_10,
                        bVar11,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX((StrX *)&actRetCanRep_inchar_3);
    local_518 = pwVar8;
    if (pwVar8 == (wchar16 *)0x0) {
      pXVar3 = getDataTypeString(dt_positiveInteger);
      StrX::StrX((StrX *)local_550,pXVar3);
      StrX::localForm((StrX *)local_550);
      printf("CANREP_TEST No CanRep returned,                                                       at line <%d> data=<%s>, datatype=<%s>\n"
             ,0xc7f,(undefined1 *)((long)&act_v_ran_v_1.fValue + 0x18));
      StrX::~StrX((StrX *)local_550);
      errSeen = true;
    }
    else {
      local_530 = (char *)xercesc_4_0::XMLString::transcode
                                    (pwVar8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      bVar2 = xercesc_4_0::XMLString::equals(local_530,lex_iv_1 + 8);
      if (!bVar2) {
        pXVar3 = getDataTypeString(dt_positiveInteger);
        StrX::StrX(&local_540,pXVar3);
        pcVar4 = StrX::localForm(&local_540);
        printf("CANREP_TEST CanRep Diff                                                         , at line <%d> data=<%s>, datatype=<%s>,                                                actCanRep=<%s>, toCompare=<%s>\n"
               ,0xc7f,(undefined1 *)((long)&act_v_ran_v_1.fValue + 0x18),pcVar4,local_530,
               lex_iv_1 + 8);
        StrX::~StrX(&local_540);
        errSeen = true;
      }
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,local_518);
      xercesc_4_0::XMLString::release(&local_530,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    actRetCanRep_4._4_4_ = st_Init;
    StrX::StrX(&local_570,lex_iv_2);
    pXVar3 = StrX::unicodeForm(&local_570);
    lVar9 = xercesc_4_0::XSValue::getCanonicalRepresentation
                      (pXVar3,dt_positiveInteger,(Status *)((long)&actRetCanRep_4 + 4),ver_10,bVar11
                       ,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_570);
    local_560 = lVar9;
    if (lVar9 == 0) {
      if (actRetCanRep_4._4_4_ != st_FOCA0002) {
        pXVar3 = getDataTypeString(dt_positiveInteger);
        StrX::StrX((StrX *)local_590,pXVar3);
        pcVar4 = StrX::localForm((StrX *)local_590);
        pcVar6 = getStatusString(st_FOCA0002);
        pcVar7 = getStatusString(actRetCanRep_4._4_4_);
        printf("CANREP_TEST Context Diff,                                                             at line <%d> data=<%s>, datatype=<%s>\n                                               expStatus=<%s>, actStatus=<%s>\n"
               ,0xc80,lex_iv_2,pcVar4,pcVar6,pcVar7);
        StrX::~StrX((StrX *)local_590);
        errSeen = true;
      }
    }
    else {
      pXVar3 = getDataTypeString(dt_positiveInteger);
      StrX::StrX(&local_580,pXVar3);
      StrX::localForm(&local_580);
      printf("CANREP_TEST CanRep returned:                                                          at line <%d> data=<%s>, datatype=<%s>\n"
             ,0xc80,lex_iv_2);
      StrX::~StrX(&local_580);
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,local_560);
      errSeen = true;
    }
    actRetCanRep_5._4_4_ = st_Init;
    StrX::StrX(&local_5b0,data_rawstr_1);
    pXVar3 = StrX::unicodeForm(&local_5b0);
    lVar9 = xercesc_4_0::XSValue::getCanonicalRepresentation
                      (pXVar3,dt_positiveInteger,(Status *)((long)&actRetCanRep_5 + 4),ver_10,bVar11
                       ,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_5b0);
    local_5a0 = lVar9;
    if (lVar9 == 0) {
      if (actRetCanRep_5._4_4_ != st_FOCA0002) {
        pXVar3 = getDataTypeString(dt_positiveInteger);
        StrX::StrX(&local_5d0,pXVar3);
        pcVar4 = StrX::localForm(&local_5d0);
        pcVar6 = getStatusString(st_FOCA0002);
        pcVar7 = getStatusString(actRetCanRep_5._4_4_);
        printf("CANREP_TEST Context Diff,                                                             at line <%d> data=<%s>, datatype=<%s>\n                                               expStatus=<%s>, actStatus=<%s>\n"
               ,0xc81,data_rawstr_1,pcVar4,pcVar6,pcVar7);
        StrX::~StrX(&local_5d0);
        errSeen = true;
      }
    }
    else {
      pXVar3 = getDataTypeString(dt_positiveInteger);
      StrX::StrX(&local_5c0,pXVar3);
      StrX::localForm(&local_5c0);
      printf("CANREP_TEST CanRep returned:                                                          at line <%d> data=<%s>, datatype=<%s>\n"
             ,0xc81,data_rawstr_1);
      StrX::~StrX(&local_5c0);
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,local_5a0);
      errSeen = true;
    }
  }
  return;
}

Assistant:

void test_dt_positiveInteger()
{
    const XSValue::DataType dt = XSValue::dt_positiveInteger;
    bool  toValidate = true;

    const char lex_v_ran_v_1[]="   1234   \n";
    const char lex_v_ran_iv_1[]="0";

    const char lex_v_ran64_v_2[]="+18446744073709551615";
    const char lex_v_ran64_iv_2[]="+18446744073709551616";

    XSValue::XSValue_Data act_v_ran_v_1;    act_v_ran_v_1.fValue.f_ulong = (uint64_t)1234ull;
    XSValue::XSValue_Data act_v_ran64_v_2;  act_v_ran64_v_2.fValue.f_ulong = (uint64_t)18446744073709551615ull;
    XSValue::XSValue_Data act_v_ran32_v_2;  act_v_ran32_v_2.fValue.f_ulong = (uint64_t)4294967295ull;

    const char lex_v_ran64_v_2_canrep[]="18446744073709551615";
    const char lex_v_ran64_iv_2_canrep[]="18446744073709551616";

    const char lex_iv_1[]="12b34.456";
    const char lex_iv_2[]="1234b56";

/***
 * 3.3.25.2 Canonical representation
 *
 * The canonical representation for positiveInteger is defined by prohibiting certain options from the
 * Lexical representation (3.3.25.1). Specifically,
 * 1. the optional "+" sign is prohibited and
 * 2. leading zeroes are prohibited.
 *
 ***/

    const char data_rawstr_1[]="  +1  \n";
    const char data_canrep_1[]="1";
    const char data_rawstr_2[]="+00012345";
    const char data_canrep_2[]="12345";

    /***
     *
     * validate
     * ---------
     *                             availability        return value      context
     *                             ----------------------------------------------
     *    lexical valid
     *            range  valid                           true              n/a
     *            range  invalid       n/a
     *    lexical invalid                                false           st_FOCA0002
     *
     ***/

    // lexical valid
    VALIDATE_TEST(lex_v_ran_v_1    , dt, EXP_RET_VALID_TRUE,  DONT_CARE);
    VALIDATE_TEST(lex_v_ran_iv_1   , dt, EXP_RET_VALID_FALSE, XSValue::st_FOCA0002);

    VALIDATE_TEST(lex_v_ran64_v_2  , dt, EXP_RET_VALID_TRUE, DONT_CARE);
    VALIDATE_TEST(lex_v_ran64_iv_2 , dt, EXP_RET_VALID_TRUE, DONT_CARE);

    // lexical invalid
    VALIDATE_TEST(lex_iv_1         , dt, EXP_RET_VALID_FALSE, XSValue::st_FOCA0002);
    VALIDATE_TEST(lex_iv_2         , dt, EXP_RET_VALID_FALSE, XSValue::st_FOCA0002);

    /***
     *
     * getActualValue
     * ---------------
     *                             availability        return value      context
     *                             ----------------------------------------------
     *  validation on
     *  =============
     *  lexical valid
     *          range  valid                              XSValue         n/a
     *          range  invalid                              0            st_Unpresentable
     *  lexical invalid                                     0            st_FOCA0002
     *
     *  validation off
     *  ==============
     *  lexical valid
     *          range  valid                              XSValue         n/a
     *          range  invalid                              0            st_Unpresentable
     *  lexical invalid                                     0            st_FOCA0002
     *
     ***/

    for (int i = 0; i < 2; i++)
    {
        //validation on/off
        toValidate = ( 0 == i) ? true : false;

        ACTVALUE_TEST(lex_v_ran_v_1,    dt, toValidate, EXP_RET_VALUE_TRUE,  DONT_CARE, act_v_ran_v_1);

        ACTVALUE_TEST(lex_v_ran64_v_2 , dt, toValidate, EXP_RET_VALUE_TRUE,  DONT_CARE, act_v_ran64_v_2);
        ACTVALUE_TEST(lex_v_ran64_iv_2, dt, toValidate, EXP_RET_VALUE_FALSE, XSValue::st_FOCA0003, act_v_ran64_v_2);

        ACTVALUE_TEST(lex_iv_1,         dt, toValidate, EXP_RET_VALUE_FALSE, XSValue::st_FOCA0002, act_v_ran32_v_2);
        ACTVALUE_TEST(lex_iv_2,         dt, toValidate, EXP_RET_VALUE_FALSE, XSValue::st_FOCA0002, act_v_ran32_v_2);
    }

    /***
     *
     * getCanonicalRepresentation
     * ---------------------------
     *                             availability        return value      context
     *                             ----------------------------------------------
     *  validation on
     *  =============
     *  lexical valid
     *          range  valid                              XMLCh          n/a
     *          range  invalid          n/a
     *  lexical invalid                                     0            st_FOCA0002
     *
     *  validation off
     *  ==============
     *  lexical valid
     *          range  valid                              XMLCh         n/a
     *          range  invalid          n/a
     *  lexical invalid                                     0            st_FOCA0002
     *
     ***/

    for (int j = 0; j < 2; j++)
    {
        //validation on/off
        toValidate = ( 0 == j)? true : false;

        CANREP_TEST(data_rawstr_1,    dt, toValidate, EXP_RET_CANREP_TRUE,  data_canrep_1,    DONT_CARE);
        CANREP_TEST(data_rawstr_2,    dt, toValidate, EXP_RET_CANREP_TRUE,  data_canrep_2,    DONT_CARE);

        CANREP_TEST(lex_v_ran64_v_2,  dt, toValidate, EXP_RET_CANREP_TRUE,  lex_v_ran64_v_2_canrep,  DONT_CARE);
        CANREP_TEST(lex_v_ran64_iv_2, dt, toValidate, EXP_RET_CANREP_TRUE,  lex_v_ran64_iv_2_canrep, DONT_CARE);
        CANREP_TEST(lex_iv_1        , dt, toValidate, EXP_RET_CANREP_FALSE, null_string,      XSValue::st_FOCA0002);
        CANREP_TEST(lex_iv_2        , dt, toValidate, EXP_RET_CANREP_FALSE, null_string,      XSValue::st_FOCA0002);

    }

}